

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O0

void __thiscall Clasp::ScoreLook::scoreLits(ScoreLook *this,Solver *s,Literal *b,Literal *e)

{
  bool bVar1;
  VarInfo VVar2;
  uint32 v_00;
  Var VVar3;
  VarType VVar4;
  reference pVVar5;
  ScoreLook *in_RCX;
  ScoreLook *in_RDX;
  ScoreLook *in_RDI;
  Var v;
  uint32 sc;
  uint in_stack_ffffffffffffffb8;
  Var in_stack_ffffffffffffffc8;
  Var in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Literal p;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint32 uVar6;
  ScoreLook *local_18;
  
  if ((in_RDI->nant & 1U) == 0) {
    v_00 = (uint32)((long)in_RCX - (long)in_RDX >> 2);
  }
  else {
    v_00 = countNant(in_RCX,(Solver *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (Literal *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (Literal *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  uVar6 = v_00;
  VVar3 = Literal::var((Literal *)in_RDX);
  bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
            (&in_RDI->score,VVar3);
  p.rep_ = *(uint32 *)&(in_RDX->score).ebo_.buf;
  VarScore::setScore((VarScore *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),p,
                     (size_type)((ulong)in_RDI >> 0x20));
  if ((in_RDI->addDeps & 1U) != 0) {
    pVVar5 = bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
                       (&in_RDI->score,VVar3);
    bVar1 = VarScore::testedBoth(pVVar5);
    local_18 = in_RDX;
    if (((bVar1) || (in_RDI->mode == score_max)) &&
       (bVar1 = greater((ScoreLook *)CONCAT44(p.rep_,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8), bVar1)) {
      in_RDI->best = VVar3;
    }
    for (; local_18 != in_RCX; local_18 = (ScoreLook *)((long)&(local_18->score).ebo_.buf + 4)) {
      VVar3 = Literal::var((Literal *)local_18);
      bVar1 = validVar(in_RDI,v_00);
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
      if (bVar1) {
        VVar2 = Solver::varInfo((Solver *)
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                (Var)((ulong)in_RDI >> 0x20));
        in_stack_ffffffffffffffd0 = CONCAT13(VVar2.rep,(int3)in_stack_ffffffffffffffd0);
        VVar4 = VarInfo::type((VarInfo *)in_RDI);
        in_stack_ffffffffffffffb8 =
             CONCAT13((VVar4 & in_RDI->types) != 0,(int3)in_stack_ffffffffffffffb8);
      }
      if ((char)(in_stack_ffffffffffffffb8 >> 0x18) != '\0') {
        pVVar5 = bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
                           (&in_RDI->score,VVar3);
        bVar1 = VarScore::seen(pVVar5);
        if (!bVar1) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(p.rep_,in_stack_ffffffffffffffd0),
                     (uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
                  (&in_RDI->score,VVar3);
        in_stack_ffffffffffffffcc = *(Var *)&(local_18->score).ebo_.buf;
        VarScore::setDepScore
                  ((VarScore *)CONCAT44(uVar6,VVar3),(Literal)(uint32)((ulong)in_RCX >> 0x20),p.rep_
                  );
        bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
                  (&in_RDI->score,VVar3);
        in_stack_ffffffffffffffc8 = *(Var *)&(local_18->score).ebo_.buf;
        VarScore::setSeen((VarScore *)CONCAT44(v_00,in_stack_ffffffffffffffb8),
                          (Literal)(uint32)((ulong)in_RDI >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void ScoreLook::scoreLits(const Solver& s, const Literal* b, const Literal *e) {
	assert(b < e);
	uint32 sc = !nant ? uint32(e-b) : countNant(s, b, e);
	Var v     = b->var();
	assert(validVar(v));
	score[v].setScore(*b, sc);
	if (addDeps) {
		if ((score[v].testedBoth() || mode == score_max) && greater(v, best)) {
			best = v;
		}
		for (; b != e; ++b) {
			v = b->var();
			if (validVar(v) && (s.varInfo(v).type() & types) != 0) {
				if (!score[v].seen()) { deps.push_back(v); }
				score[v].setDepScore(*b, sc);
				score[v].setSeen(*b);
			}
		}
	}
}